

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O1

bool __thiscall
avro::BufferReader::read<unsigned_long>(BufferReader *this,unsigned_long *val,true_type *param_2)

{
  ulong uVar1;
  _Elt_pointer pCVar2;
  data_type *__nbytes;
  
  uVar1 = this->bytesRemaining_;
  if (7 < uVar1) {
    pCVar2 = (this->iter_)._M_cur;
    __nbytes = pCVar2->readPos_;
    if (pCVar2->writePos_ + (-(long)__nbytes - this->chunkPos_) < (data_type *)0x8) {
      read(this,(int)val,(void *)0x8,(size_t)__nbytes);
    }
    else {
      *val = *(unsigned_long *)(__nbytes + this->chunkPos_);
      incrementChunk(this,8);
    }
  }
  return 7 < uVar1;
}

Assistant:

bool read(T &val, const boost::true_type&)
    {
        if(sizeof(T) > bytesRemaining_) {
            return false;
        }

        if (sizeof(T) <= chunkRemaining()) {
            val = *(reinterpret_cast<const T*> (addr()));
            incrementChunk(sizeof(T));
        }
        else {
            read(reinterpret_cast<data_type *>(&val), sizeof(T));
        }
        return true;
    }